

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::VarSourceVisitor::visit(VarSourceVisitor *this,Var *var)

{
  Var *var_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  Var **ppVVar3;
  mapped_type *set;
  Var *right;
  value_type *stmt;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sources;
  _Node_iterator_base<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>,_false>
  local_20;
  Var *local_18;
  Var *var_local;
  VarSourceVisitor *this_local;
  
  local_18 = var;
  var_local = (Var *)this;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<kratos::Var_*,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>_>
       ::find(&this->map_,&local_18);
  sources = (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             *)std::
               unordered_map<kratos::Var_*,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>_>
               ::end(&this->map_);
  bVar1 = std::__detail::operator!=
                    (&local_20,
                     (_Node_iterator_base<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>,_false>
                      *)&sources);
  if (!bVar1) {
    iVar2 = (*(local_18->super_IRNode)._vptr_IRNode[0x10])();
    __end2 = std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)CONCAT44(extraout_var,iVar2));
    stmt = (value_type *)
           std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                  *)CONCAT44(extraout_var,iVar2));
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                              ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)
                               &stmt), bVar1) {
      this_00 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )std::__detail::
                 _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                           (&__end2);
      this_01 = std::
                __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_00);
      ppVVar3 = AssignStmt::right(this_01);
      var_00 = *ppVVar3;
      set = std::
            unordered_map<kratos::Var_*,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>_>_>_>
            ::operator[](&this->map_,&local_18);
      get_source_var(var_00,set);
      std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
      operator++(&__end2);
    }
  }
  return;
}

Assistant:

void visit(Var *var) override {
        if (map_.find(var) != map_.end()) return;
        auto const &sources = var->sources();
        for (auto const &stmt : sources) {
            auto *right = stmt->right();
            get_source_var(right, map_[var]);
        }
    }